

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

void __thiscall AGSSockAPI::Thread::stop(Thread *this)

{
  Mutex *__mutex;
  
  if (this->data != (Data *)0x0) {
    __mutex = &this->data->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (this->data->active == true) {
      pthread_cancel(this->data->thread);
      this->data->active = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0xf7,"void AGSSockAPI::Thread::stop()");
}

Assistant:

void Thread::stop()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		if (data->active)
		{
		#ifdef _WIN32
			TerminateThread(data->handle, 0);
		#else
			pthread_cancel(data->thread);
		#endif
			data->active = false;
		}
		// Why is this not in the conditional?
	#ifdef _WIN32
		CloseHandle(data->handle);
	#endif
	}
}